

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModel.cpp
# Opt level: O2

void __thiscall FMB::FiniteModel::FiniteModel(FiniteModel *this,uint size)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  double dVar4;
  
  this->_size = size;
  this->_isPartial = false;
  uVar2 = 1;
  (this->_functionCoverage)._timestamp = 1;
  (this->_functionCoverage)._size = 0;
  (this->_functionCoverage)._deleted = 0;
  (this->_functionCoverage)._capacityIndex = 0;
  (this->_functionCoverage)._capacity = 0;
  *(undefined8 *)&(this->_functionCoverage)._nextExpansionOccupancy = 0;
  *(undefined8 *)((long)&(this->_functionCoverage)._entries + 4) = 0;
  *(undefined8 *)((long)&(this->_functionCoverage)._afterLast + 4) = 0x100000000;
  memset(&(this->_predicateCoverage)._size,0,0x84);
  (this->_domainConstants)._timestamp = 1;
  (this->_domainConstants)._size = 0;
  (this->_domainConstants)._deleted = 0;
  (this->_domainConstants)._capacityIndex = 0;
  (this->_domainConstants)._capacity = 0;
  *(undefined8 *)&(this->_domainConstants)._nextExpansionOccupancy = 0;
  *(undefined8 *)((long)&(this->_domainConstants)._entries + 4) = 0;
  *(undefined8 *)((long)&(this->_domainConstants)._afterLast + 4) = 0x100000000;
  (this->_domainConstantsRev)._size = 0;
  (this->_domainConstantsRev)._deleted = 0;
  (this->_domainConstantsRev)._capacityIndex = 0;
  (this->_domainConstantsRev)._capacity = 0;
  *(undefined4 *)((long)&(this->_domainConstantsRev)._afterLast + 4) = 0;
  *(undefined8 *)&(this->_domainConstantsRev)._nextExpansionOccupancy = 0;
  *(undefined8 *)((long)&(this->_domainConstantsRev)._entries + 4) = 0;
  Lib::DArray<unsigned_int>::ensure
            (&this->f_offsets,
             (ulong)(*(long *)(DAT_00a14190 + 0x68) - *(long *)(DAT_00a14190 + 0x60)) >> 3 &
             0xffffffff);
  Lib::DArray<unsigned_int>::ensure
            (&this->p_offsets,
             (ulong)(*(long *)(DAT_00a14190 + 0x88) - *(long *)(DAT_00a14190 + 0x80)) >> 3 &
             0xffffffff);
  lVar3 = 0;
  while( true ) {
    if ((uint)((ulong)(*(long *)(DAT_00a14190 + 0x68) - *(long *)(DAT_00a14190 + 0x60)) >> 3) <=
        (uint)lVar3) break;
    iVar1 = *(int *)(*(long *)(*(long *)(DAT_00a14190 + 0x60) + (long)(int)(uint)lVar3 * 8) + 0x20);
    (this->f_offsets)._array[lVar3] = uVar2;
    dVar4 = pow((double)size,(double)(iVar1 + 1));
    uVar2 = (int)(long)dVar4 + uVar2;
    lVar3 = lVar3 + 1;
  }
  Lib::DArray<unsigned_int>::expand(&this->f_interpretation,(ulong)(uVar2 + 1),0);
  uVar2 = 1;
  lVar3 = 1;
  while( true ) {
    if ((uint)((ulong)(*(long *)(DAT_00a14190 + 0x88) - *(long *)(DAT_00a14190 + 0x80)) >> 3) <=
        (uint)lVar3) break;
    iVar1 = *(int *)(*(long *)(*(long *)(DAT_00a14190 + 0x80) + (long)(int)(uint)lVar3 * 8) + 0x20);
    (this->p_offsets)._array[lVar3] = uVar2;
    dVar4 = pow((double)size,(double)(iVar1 + 1));
    uVar2 = (int)(long)dVar4 + uVar2;
    lVar3 = lVar3 + 1;
  }
  Lib::DArray<unsigned_int>::expand(&this->p_interpretation,(ulong)(uVar2 + 1),0);
  return;
}

Assistant:

FiniteModel::FiniteModel(unsigned size) : _size(size), _isPartial(false)
{
  (void)_isPartial; // to suppress unused warning

  f_offsets.ensure(env.signature->functions());
  p_offsets.ensure(env.signature->predicates());

  // generate offsets per function for indexing f_interpreation
  // see addFunctionDefinition for how the offset is used to compute
  // the actual index
  unsigned offsets=1;
  for(unsigned f=0; f<env.signature->functions(); f++){
    unsigned arity=env.signature->functionArity(f);
    f_offsets[f]=offsets;
    unsigned add = pow(size,arity+1);
    ASS(UINT_MAX - add > offsets);
    offsets += add;
  }
  f_interpretation.expand(offsets+1,0);
  // can restart for predicates as indexing p_interepration instead
  offsets=1;
  for(unsigned p=1; p<env.signature->predicates();p++){
    unsigned arity=env.signature->predicateArity(p);
    p_offsets[p]=offsets;
    unsigned add = pow(size,arity+1);
    ASS(UINT_MAX - add > offsets);
    offsets += add;
  }
  p_interpretation.expand(offsets+1,0);

}